

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_NtkAddClauses(Ifn_Ntk_t *p,int *pValues,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  Ifn_Obj_t *pIVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  char cVar18;
  int pLits [13];
  int pLits2 [13];
  uint local_c8 [16];
  long local_88;
  uint *local_80;
  ulong local_78;
  ulong local_70;
  uint local_68 [14];
  ulong uVar14;
  
  iVar1 = sat_solver_nvars(pSat);
  iVar10 = p->nObjs;
  if (0 < (long)iVar10) {
    iVar6 = iVar1 << 0x10;
    iVar1 = iVar1 + iVar10;
    lVar12 = 0;
    do {
      *(uint *)((long)p->Nodes[0].Fanins + lVar12 + -4) =
           (uint)*(ushort *)((long)p->Nodes[0].Fanins + lVar12 + -4) + iVar6;
      lVar12 = lVar12 + 0x30;
      iVar6 = iVar6 + 0x10000;
    } while ((long)iVar10 * 0x30 != lVar12);
  }
  sat_solver_setnvars(pSat,iVar1);
  uVar15 = p->nVars;
  lVar12 = (long)(int)uVar15;
  if (0 < lVar12) {
    lVar4 = 0;
    do {
      if (pValues[lVar4] == -1) {
        __assert_fail("pValues[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x462,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar12 != lVar4);
  }
  iVar10 = p->nObjs;
  if ((int)uVar15 < iVar10 + -1) {
    lVar4 = 0;
    do {
      if (pValues[lVar12 + lVar4] != -1) {
        __assert_fail("pValues[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x464,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      lVar4 = lVar4 + 1;
    } while (~uVar15 + iVar10 != (int)lVar4);
  }
  if (pValues[(long)iVar10 + -1] == -1) {
    __assert_fail("pValues[p->nObjs-1] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x465,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
  }
  iVar10 = p->nInps;
  if (0 < iVar10) {
    lVar12 = 0;
    do {
      if (0 < p->nVars) {
        iVar10 = p->nParsVNum * (int)lVar12 + p->nParsVIni;
        lVar4 = 0;
        do {
          local_c8[0] = (uint)(pValues[lVar4] == 0) +
                        (uint)*(ushort *)&p->Nodes[lVar12].field_0x2 * 2;
          lVar3 = (long)p->nParsVNum;
          if (0 < lVar3) {
            lVar7 = 0;
            iVar1 = iVar10 * 2;
            do {
              if ((int)(iVar10 + (uint)lVar7) < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_c8[lVar7 + 1] = iVar1 + (uint)(((uint)lVar4 >> ((uint)lVar7 & 0x1f) & 1) != 0);
              lVar7 = lVar7 + 1;
              iVar1 = iVar1 + 2;
            } while (lVar3 != lVar7);
          }
          iVar1 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + lVar3 + 1));
          if (iVar1 == 0) {
            return 0;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < p->nVars);
      }
      lVar12 = lVar12 + 1;
      iVar10 = p->nInps;
    } while (lVar12 < iVar10);
  }
  iVar1 = p->nObjs;
  if (iVar10 < iVar1) {
    lVar12 = (long)iVar10;
    piVar11 = p->Nodes[lVar12].Fanins;
    do {
      uVar15 = *(uint *)(p->Nodes + lVar12);
      if (3 < (uVar15 & 7) - 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x4d7,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      pIVar8 = p->Nodes + lVar12;
      uVar13 = uVar15 >> 3 & 0x1f;
      uVar14 = (ulong)uVar13;
      local_88 = lVar12;
      local_70 = uVar14;
      switch(uVar15 & 7) {
      case 3:
        local_c8[0] = uVar15 >> 0xf & 0xfffffffe;
        if (uVar13 == 0) {
          uVar5 = 1;
        }
        else {
          uVar9 = 1;
          do {
            uVar15 = *(uint *)(p->Nodes + piVar11[uVar9 - 1]) >> 0xf;
            local_c8[uVar9] = uVar15 | 1;
            local_68[0] = *(uint *)pIVar8 >> 0xf | 1;
            local_68[1] = uVar15 & 0xfffffffe;
            iVar10 = sat_solver_addclause(pSat,(lit *)local_68,(lit *)(local_68 + 2));
            if (iVar10 == 0) {
              return 0;
            }
            uVar5 = uVar9 + 1;
            bVar17 = uVar9 != uVar14;
            uVar9 = uVar5;
          } while (bVar17);
        }
        iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + uVar5));
        lVar12 = local_88;
        if (iVar10 == 0) {
          return 0;
        }
        break;
      case 4:
        uVar15 = 2 << (sbyte)uVar13;
        if (0 < (int)uVar15) {
          local_80 = local_c8 + uVar14 + 1;
          uVar16 = 0;
          local_78 = CONCAT44(local_78._4_4_,uVar15);
          uVar5 = uVar14;
          do {
            uVar2 = 0;
            iVar10 = 0;
            do {
              uVar2 = uVar2 + (uVar16 >> ((byte)iVar10 & 0x1f));
              iVar10 = iVar10 + 1;
            } while (uVar13 + 1 != iVar10);
            cVar18 = '\x1c';
            if ((uVar2 & 1) != 0) {
              local_c8[0] = (uint)((uVar16 >> ((uint)uVar5 & 0x1f) & 1) != 0) +
                            (uint)*(ushort *)&pIVar8->field_0x2 * 2;
              if ((uint)uVar5 != 0) {
                uVar5 = 0;
                do {
                  local_c8[uVar5 + 1] =
                       (uint)((uVar16 >> ((uint)uVar5 & 0x1f) & 1) != 0) +
                       (uint)*(ushort *)&p->Nodes[piVar11[uVar5]].field_0x2 * 2;
                  uVar5 = uVar5 + 1;
                } while (uVar14 != uVar5);
              }
              iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)local_80);
              cVar18 = iVar10 == 0;
              uVar5 = local_70;
              lVar12 = local_88;
              uVar15 = (uint)local_78;
            }
            if ((cVar18 != '\x1c') && (cVar18 != '\0')) goto LAB_00443180;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
          cVar18 = '\0';
LAB_00443180:
          if (cVar18 != '\0') {
            return 0;
          }
        }
        break;
      case 5:
        local_c8[0] = uVar15 >> 0xf & 0xfffffffe;
        local_c8[1] = *(uint *)(p->Nodes + pIVar8->Fanins[0]) >> 0xf | 1;
        local_c8[2] = *(uint *)(p->Nodes + pIVar8->Fanins[1]) >> 0xf | 1;
        iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + 3));
        if (iVar10 == 0) {
          return 0;
        }
        local_c8[0] = *(uint *)pIVar8 >> 0xf | 1;
        local_c8[1] = *(uint *)(p->Nodes + pIVar8->Fanins[0]) >> 0xf | 1;
        local_c8[2] = (uint)*(ushort *)&p->Nodes[pIVar8->Fanins[1]].field_0x2 * 2;
        iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + 3));
        if (iVar10 == 0) {
          return 0;
        }
        local_c8[0] = (uint)*(ushort *)&pIVar8->field_0x2 * 2;
        local_c8[1] = (uint)*(ushort *)&p->Nodes[pIVar8->Fanins[0]].field_0x2 * 2;
        local_c8[2] = *(uint *)(p->Nodes + pIVar8->Fanins[2]) >> 0xf | 1;
        iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + 3));
        if (iVar10 == 0) {
          return 0;
        }
        local_c8[0] = *(uint *)pIVar8 >> 0xf | 1;
        local_c8[1] = (uint)*(ushort *)&p->Nodes[pIVar8->Fanins[0]].field_0x2 * 2;
        local_c8[2] = (uint)*(ushort *)&p->Nodes[pIVar8->Fanins[2]].field_0x2 * 2;
        iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + 3));
        lVar12 = local_88;
        if (iVar10 == 0) {
          return 0;
        }
        break;
      case 6:
        if (uVar13 != 0x1f) {
          local_78 = (ulong)(uVar15 >> 8 & 0xff);
          iVar10 = 1 << (sbyte)uVar13;
          if (iVar10 < 2) {
            iVar10 = 1;
          }
          local_80 = (uint *)CONCAT44(local_80._4_4_,iVar10);
          uVar15 = 0;
          do {
            iVar10 = pValues[lVar12];
            bVar17 = iVar10 == -1;
            if (bVar17) {
              local_c8[0] = *(uint *)pIVar8 >> 0xf & 0xfffffffe;
              local_68[0] = *(uint *)pIVar8 >> 0xf | 1;
            }
            uVar13 = (uint)bVar17;
            if ((int)local_70 != 0) {
              uVar5 = 0;
              do {
                uVar13 = (uint)((uVar15 >> ((uint)uVar5 & 0x1f) & 1) != 0) +
                         (uint)*(ushort *)&p->Nodes[piVar11[uVar5]].field_0x2 * 2;
                local_68[bVar17 + uVar5] = uVar13;
                local_c8[bVar17 + uVar5] = uVar13;
                uVar5 = uVar5 + 1;
              } while (uVar14 != uVar5);
              uVar13 = (uint)bVar17 + (int)uVar5;
            }
            iVar1 = (int)local_78 + uVar15;
            local_c8[uVar13] = iVar1 * 2 + 1;
            local_68[uVar13] = iVar1 * 2;
            if ((iVar10 != 0) &&
               (iVar10 = sat_solver_addclause(pSat,(lit *)local_68,(lit *)(local_68 + (uVar13 + 1)))
               , lVar12 = local_88, iVar10 == 0)) {
              return 0;
            }
            if ((pValues[lVar12] != 1) &&
               (iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + (uVar13 + 1)))
               , lVar12 = local_88, iVar10 == 0)) {
              return 0;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != (uint)local_80);
        }
      }
      lVar12 = lVar12 + 1;
      iVar1 = p->nObjs;
      piVar11 = piVar11 + 0xc;
    } while (lVar12 < iVar1);
  }
  local_c8[0] = (uint)(pValues[(long)iVar1 + -1] == 0) +
                (uint)*(ushort *)&p->Nodes[(long)iVar1 + -1].field_0x2 * 2;
  iVar10 = sat_solver_addclause(pSat,(lit *)local_c8,(lit *)(local_c8 + 1));
  return (uint)(iVar10 != 0);
}

Assistant:

int Ifn_NtkAddClauses( Ifn_Ntk_t * p, int * pValues, sat_solver * pSat )
{
    int i, f, v, nLits, pLits[IFN_INS+2], pLits2[IFN_INS+2];
    // assign new variables
    int nSatVars = sat_solver_nvars(pSat);
//    for ( i = 0; i < p->nObjs-1; i++ )
    for ( i = 0; i < p->nObjs; i++ )
        p->Nodes[i].Var = nSatVars++;
    //p->Nodes[p->nObjs-1].Var = 0xFFFF;
    sat_solver_setnvars( pSat, nSatVars );
    // verify variable values
    for ( i = 0; i < p->nVars; i++ )
        assert( pValues[i] != -1 );
    for ( i = p->nVars; i < p->nObjs-1; i++ )
        assert( pValues[i] == -1 );
    assert( pValues[p->nObjs-1] != -1 );
    // internal variables
//printf( "\n" );
    for ( i = 0; i < p->nInps; i++ )
    {
        int iParStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = 0; v < p->nVars; v++ )
        {
            // add output literal
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, pValues[v]==0 );
            // add clause literals
            for ( f = 0; f < p->nParsVNum; f++ )
                pLits[f+1] = Abc_Var2Lit( iParStart + f, (v >> f) & 1 ); 
            if ( !Ifn_AddClause( pSat, pLits, pLits+p->nParsVNum+1 ) )
                return 0;
        }
    }
//printf( "\n" );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            nLits = 0;
            pLits[nLits++] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            for ( f = 0; f < nFans; f++ )
            {
                pLits[nLits++] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 1 );
                // add small clause
                pLits2[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                pLits2[1] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 0 );
                if ( !Ifn_AddClause( pSat, pLits2, pLits2 + 2 ) )
                    return 0;
            }
            // add big clause
            if ( !Ifn_AddClause( pSat, pLits, pLits + nLits ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            int m, nMints = (1 << (nFans+1));
            for ( m = 0; m < nMints; m++ )
            {
                // skip even 
                int Count = 0;
                for ( v = 0; v <= nFans; v++ )
                    Count += ((m >> v) & 1);
                if ( (Count & 1) == 0 )
                    continue;
                // generate minterm
                pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, (m >> nFans) & 1 );
                for ( v = 0; v < nFans; v++ )
                    pLits[v+1] = Abc_Var2Lit( p->Nodes[pFans[v]].Var, (m >> v) & 1 );
                if ( !Ifn_AddClause( pSat, pLits, pLits + nFans + 1 ) )
                    return 0;
            }
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            int iParStart = p->Nodes[i].iFirst;
            for ( v = 0; v < nValues; v++ )
            {
                nLits = 0;
                if ( pValues[i] == -1 )
                {
                    pLits[nLits]  = Abc_Var2Lit( p->Nodes[i].Var, 0 );
                    pLits2[nLits] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                    nLits++;
                }
                for ( f = 0; f < nFans; f++, nLits++ )
                    pLits[nLits] = pLits2[nLits] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, (v >> f) & 1 ); 
                pLits[nLits]  = Abc_Var2Lit( iParStart + v, 1 ); 
                pLits2[nLits] = Abc_Var2Lit( iParStart + v, 0 ); 
                nLits++;
                if ( pValues[i] != 0 )
                {
                    if ( !Ifn_AddClause( pSat, pLits2, pLits2 + nLits ) )
                        return 0;
                }
                if ( pValues[i] != 1 )
                {
                    if ( !Ifn_AddClause( pSat, pLits,  pLits + nLits ) )
                        return 0;
                }
            }
        }
        else assert( 0 );
//printf( "\n" );
    }
    // add last clause (not needed if the root node is IFN_DSD_PRIME)
    pLits[0] = Abc_Var2Lit( p->Nodes[p->nObjs-1].Var, pValues[p->nObjs-1]==0 );
    if ( !Ifn_AddClause( pSat, pLits,  pLits + 1 ) )
        return 0;
    return 1;
}